

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDMeshFragment * __thiscall
ON_SubDMeshFragment::PreviousFaceFragment(ON_SubDMeshFragment *this,bool bLastFromFirst)

{
  ON_SubDMeshFragment *pOVar1;
  bool bLastFromFirst_local;
  ON_SubDMeshFragment *this_local;
  
  if ((this->m_face != (ON_SubDFace *)0x0) &&
     (this->m_face_fragment_index < this->m_face_fragment_count)) {
    if ((bLastFromFirst) && (this->m_face_fragment_index == 0)) {
      pOVar1 = LastFaceFragment(this);
      return pOVar1;
    }
    if ((((this->m_face_fragment_index != 0) &&
         (this->m_prev_fragment != (ON_SubDMeshFragment *)0x0)) &&
        (this->m_face == this->m_prev_fragment->m_face)) &&
       ((this->m_face_fragment_count == this->m_prev_fragment->m_face_fragment_count &&
        (this->m_face_fragment_index - 1 == (uint)this->m_prev_fragment->m_face_fragment_index)))) {
      return this->m_prev_fragment;
    }
  }
  return (ON_SubDMeshFragment *)0x0;
}

Assistant:

const ON_SubDMeshFragment* ON_SubDMeshFragment::PreviousFaceFragment(
  bool bLastFromFirst
) const
{
  if ( nullptr != m_face && m_face_fragment_index < m_face_fragment_count )
  {
    if (bLastFromFirst && 0 == m_face_fragment_index)
    {
      return LastFaceFragment();
    }
    else if (
      m_face_fragment_index > 0
      && nullptr != m_prev_fragment
      && m_face == m_prev_fragment->m_face
      && m_face_fragment_count == m_prev_fragment->m_face_fragment_count
      && m_face_fragment_index - 1 == m_prev_fragment->m_face_fragment_index
      )
    {
      return m_prev_fragment;
    }
  }
  return nullptr;
}